

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::ContainsKey(BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *this,TestObject **key)

{
  int *piVar1;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<TestObject>,_bool> *pSVar2;
  uint uVar3;
  Type this_00;
  uint uVar4;
  
  piVar1 = (this->buckets).ptr;
  uVar3 = 0;
  if (piVar1 != (int *)0x0) {
    uVar3 = GetBucket((uint)((ulong)*key >> 3) | 1,this->bucketCount,this->modFunctionIndex);
    uVar4 = piVar1[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar4) {
      pSVar2 = (this->entries).ptr;
      uVar3 = 0;
      do {
        if (pSVar2[uVar4].
            super_DefaultHashedEntry<Memory::WriteBarrierPtr<TestObject>,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<Memory::WriteBarrierPtr<TestObject>,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>_>
            .super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>.key.ptr ==
            *key) {
          this_00 = this->stats;
          goto LAB_0075cd92;
        }
        uVar3 = uVar3 + 1;
        uVar4 = pSVar2[uVar4].
                super_DefaultHashedEntry<Memory::WriteBarrierPtr<TestObject>,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Memory::WriteBarrierPtr<TestObject>,_bool>.
                super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>_>
                .super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>.next;
      } while (-1 < (int)uVar4);
    }
  }
  this_00 = this->stats;
  uVar4 = 0xffffffff;
LAB_0075cd92:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  return -1 < (int)uVar4;
}

Assistant:

bool ContainsKey(const TKey& key) const
        {
            return FindEntry(key) >= 0;
        }